

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_77::BinaryReaderIR::SetBlockDeclaration
          (BinaryReaderIR *this,BlockDeclaration *decl,Type sig_type)

{
  FuncDeclaration *decl_00;
  bool bVar1;
  Index index;
  TypeVector local_a8;
  Location local_90;
  Var local_70;
  Index local_24;
  BlockDeclaration *pBStack_20;
  Index type_index;
  BlockDeclaration *decl_local;
  BinaryReaderIR *this_local;
  Type sig_type_local;
  
  pBStack_20 = decl;
  decl_local = (BlockDeclaration *)this;
  this_local._4_4_ = sig_type.enum_;
  bVar1 = Type::IsIndex((Type *)((long)&this_local + 4));
  if (bVar1) {
    index = Type::GetIndex((Type *)((long)&this_local + 4));
    decl_00 = pBStack_20;
    local_24 = index;
    Location::Location(&local_90);
    Var::Var(&local_70,index,&local_90);
    SetFuncDeclaration(this,decl_00,&local_70);
    Var::~Var(&local_70);
  }
  else {
    pBStack_20->has_func_type = false;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::clear(&(pBStack_20->sig).param_types);
    Type::GetInlineVector(&local_a8,(Type *)((long)&this_local + 4));
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
              (&(pBStack_20->sig).result_types,&local_a8);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_a8);
  }
  return;
}

Assistant:

void BinaryReaderIR::SetBlockDeclaration(BlockDeclaration* decl,
                                         Type sig_type) {
  if (sig_type.IsIndex()) {
    Index type_index = sig_type.GetIndex();
    SetFuncDeclaration(decl, Var(type_index));
  } else {
    decl->has_func_type = false;
    decl->sig.param_types.clear();
    decl->sig.result_types = sig_type.GetInlineVector();
  }
}